

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Cpu.h
# Opt level: O2

void __thiscall Hes_Emu::irq_changed(Hes_Emu *this)

{
  byte bVar1;
  state_t *psVar2;
  int iVar3;
  int iVar4;
  int t;
  
  psVar2 = (this->super_Hes_Cpu).state;
  iVar4 = psVar2->base + psVar2->time;
  iVar3 = (this->irq).timer;
  if (iVar4 < iVar3) {
    (this->irq).timer = 0x40000000;
    iVar3 = 0x40000000;
    if (((this->timer).enabled != '\0') && ((this->timer).fired == '\0')) {
      iVar3 = (this->timer).count + iVar4;
      (this->irq).timer = iVar3;
    }
  }
  t = (this->irq).vdp;
  if (iVar4 < t) {
    (this->irq).vdp = 0x40000000;
    t = 0x40000000;
    if (((this->vdp).control & 8) != 0) {
      t = (this->vdp).next_vbl;
      (this->irq).vdp = t;
    }
  }
  bVar1 = (this->irq).disables;
  iVar4 = 0x40000000;
  if ((bVar1 & 4) == 0) {
    iVar4 = iVar3;
  }
  if (iVar4 < t) {
    t = iVar4;
  }
  if ((bVar1 & 2) != 0) {
    t = iVar4;
  }
  Hes_Cpu::set_irq_time(&this->super_Hes_Cpu,t);
  return;
}

Assistant:

hes_time_t time() const             { return state->time + state->base; }